

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O2

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  _func_int **pp_Var4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  _func_int *p_Var14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  float fVar17;
  undefined1 auVar18 [16];
  
  iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  pp_Var4 = this->_vptr_Clip_x86;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar5 = bottom_top_blob->data;
    sVar6 = bottom_top_blob->elemsize;
    sVar7 = bottom_top_blob->cstep;
    pauVar15 = (undefined1 (*) [16])(sVar7 * uVar11 * sVar6 + (long)pvVar5);
    uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
    uVar2 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
    lVar12 = 0;
    for (iVar16 = 0; iVar16 + 3 < iVar9; iVar16 = iVar16 + 4) {
      auVar18._4_4_ = uVar1;
      auVar18._0_4_ = uVar1;
      auVar18._8_4_ = uVar1;
      auVar18._12_4_ = uVar1;
      auVar18 = maxps(*pauVar15,auVar18);
      auVar8._4_4_ = uVar2;
      auVar8._0_4_ = uVar2;
      auVar8._8_4_ = uVar2;
      auVar8._12_4_ = uVar2;
      auVar18 = minps(auVar18,auVar8);
      *pauVar15 = auVar18;
      pauVar15 = pauVar15 + 1;
      lVar12 = lVar12 + 4;
    }
    lVar13 = sVar7 * sVar6 * uVar11;
    for (; (int)lVar12 < iVar9; lVar12 = lVar12 + 1) {
      fVar17 = *(float *)((long)pvVar5 + lVar12 * 4 + lVar13);
      p_Var14 = pp_Var4[-3];
      fVar3 = *(float *)(&this->field_0xd0 + (long)p_Var14);
      if (fVar17 < fVar3) {
        *(float *)((long)pvVar5 + lVar12 * 4 + lVar13) = fVar3;
        p_Var14 = pp_Var4[-3];
        fVar17 = fVar3;
      }
      if (*(float *)(&this->field_0xd4 + (long)p_Var14) < fVar17) {
        *(float *)((long)pvVar5 + lVar12 * 4 + lVar13) =
             *(float *)(&this->field_0xd4 + (long)p_Var14);
      }
    }
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}